

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O2

void pulse_prog_demon(CHAR_DATA *mob)

{
  CHAR_DATA *victim;
  int iVar1;
  char buf [250];
  
  victim = mob->hunting;
  if ((((victim == (CHAR_DATA *)0x0) || (mob->in_room == (ROOM_INDEX_DATA *)0x0)) ||
      (victim->in_room == (ROOM_INDEX_DATA *)0x0)) || (0 < victim->ghost)) {
    if ((mob->master != (CHAR_DATA *)0x0) && (0 < victim->ghost)) {
      sprintf(buf,"%s I have taken the soul of %s. Your debt will one day be collected.",
              mob->master->name);
      do_tell(mob,buf);
    }
    act("$n returns to the Hells.",mob,(void *)0x0,(void *)0x0,4);
    extract_char(mob,true);
  }
  else {
    iVar1 = number_percent();
    if ((iVar1 < 0x33) && (mob->fighting == (CHAR_DATA *)0x0)) {
      if (mob->position != 8) {
        mob->position = 8;
      }
      if (victim->in_room->vnum != mob->in_room->vnum) {
        act("$n steps through a portal, seeking $s prey.",mob,(void *)0x0,(void *)0x0,4);
        char_from_room(mob);
        char_to_room(mob,victim->in_room);
        act("$n arrives through a portal, seeking $N\'s blood!",mob,(void *)0x0,victim,1);
        act("$n arrives through a portal, seeking your blood!",mob,(void *)0x0,victim,2);
      }
      act("$n gestures at $N, uttering curses.",mob,(void *)0x0,victim,1);
      act("$n gestures at you, uttering curses.",mob,(void *)0x0,victim,2);
      multi_hit(mob,victim,-1);
      return;
    }
  }
  return;
}

Assistant:

void pulse_prog_demon(CHAR_DATA *mob)
{
	CHAR_DATA *elemental = mob;
	CHAR_DATA *victim = elemental->hunting;
	char buf[250];

	if (!victim || !elemental->in_room || !victim->in_room || victim->ghost > 0)
	{
		if (mob->master && victim->ghost > 0)
		{
			sprintf(buf, "%s I have taken the soul of %s. Your debt will one day be collected.", mob->master->name, victim->name);
			do_tell(mob, buf);
		}

		act("$n returns to the Hells.", elemental, 0, 0, TO_ALL);
		extract_char(mob, true);
		return;
	}

	if (number_percent() > 50)
		return;

	if (elemental->fighting)
		return;

	if (mob->position != POS_STANDING)
		mob->position = POS_STANDING;

	if (victim->in_room->vnum != elemental->in_room->vnum)
	{
		act("$n steps through a portal, seeking $s prey.", elemental, 0, 0, TO_ALL);

		char_from_room(elemental);
		char_to_room(elemental, victim->in_room);

		act("$n arrives through a portal, seeking $N's blood!", elemental, 0, victim, TO_NOTVICT);
		act("$n arrives through a portal, seeking your blood!", elemental, 0, victim, TO_VICT);
	}

	act("$n gestures at $N, uttering curses.", elemental, 0, victim, TO_NOTVICT);
	act("$n gestures at you, uttering curses.", elemental, 0, victim, TO_VICT);

	multi_hit(elemental, victim, TYPE_UNDEFINED);
}